

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::JsSupport::ReadCodeFromFile
               (ThreadContext *threadContext,bool fromEvent,uint32 bodyId,bool isUtf8Source,
               byte *sourceBuffer,uint32 length)

{
  ThreadContextTTD *pTVar1;
  TTDOpenResourceStreamCallback p_Var2;
  bool bVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uStack_b8;
  bool ok;
  size_t readCount;
  size_t sStack_a8;
  bool okBOC_1;
  size_t byteOrderCount_1;
  byte byteOrderArray_1 [2];
  size_t sStack_98;
  bool okBOC;
  size_t byteOrderCount;
  JsTTDStreamHandle pvStack_88;
  byte byteOrderArray [3];
  JsTTDStreamHandle srcStream;
  TTDataIOInfo *iofp;
  char asciiResourceName [64];
  uint32 length_local;
  byte *sourceBuffer_local;
  bool isUtf8Source_local;
  uint32 bodyId_local;
  bool fromEvent_local;
  ThreadContext *threadContext_local;
  
  pcVar5 = "";
  if (fromEvent) {
    pcVar5 = "_ld";
  }
  sprintf_s((char *)&iofp,0x40,"src%s_%I32u.js",pcVar5,(ulong)bodyId);
  pTVar1 = threadContext->TTDContext;
  p_Var2 = (pTVar1->TTDataIOInfo).pfOpenResourceStream;
  sVar6 = (pTVar1->TTDataIOInfo).ActiveTTUriLength;
  pcVar5 = (pTVar1->TTDataIOInfo).ActiveTTUri;
  sVar4 = strlen((char *)&iofp);
  pvStack_88 = (*p_Var2)(sVar6,pcVar5,sVar4,(char *)&iofp,true,false);
  if (pvStack_88 != (JsTTDStreamHandle)0x0) {
    if (isUtf8Source) {
      memset((void *)((long)&byteOrderCount + 5),0,3);
      sStack_98 = 0;
      byteOrderCount_1._7_1_ =
           (*(pTVar1->TTDataIOInfo).pfReadBytesFromStream)
                     (pvStack_88,(byte *)((long)&byteOrderCount + 5),3,&stack0xffffffffffffff68);
      if (((!(bool)byteOrderCount_1._7_1_) || (sStack_98 != 3)) ||
         ((byteOrderCount._5_1_ != -0x11 ||
          ((byteOrderCount._6_1_ != -0x45 || (byteOrderCount._7_1_ != -0x41)))))) {
        TTDAbort_unrecoverable_error("Read Failed!!!");
      }
    }
    else {
      memset((void *)((long)&byteOrderCount_1 + 5),0,2);
      sStack_a8 = 0;
      readCount._7_1_ =
           (*(pTVar1->TTDataIOInfo).pfReadBytesFromStream)
                     (pvStack_88,(byte *)((long)&byteOrderCount_1 + 5),2,&stack0xffffffffffffff58);
      if ((((!(bool)readCount._7_1_) || (sStack_a8 != 2)) || (byteOrderCount_1._5_1_ != -1)) ||
         (byteOrderCount_1._6_1_ != -2)) {
        TTDAbort_unrecoverable_error("Read Failed!!!");
      }
    }
    uStack_b8 = 0;
    bVar3 = (*(pTVar1->TTDataIOInfo).pfReadBytesFromStream)
                      (pvStack_88,sourceBuffer,(size_t)length,&stack0xffffffffffffff48);
    if ((bVar3) && (uStack_b8 == length)) {
      (*(pTVar1->TTDataIOInfo).pfFlushAndCloseStream)(pvStack_88,true,false);
      return;
    }
    TTDAbort_unrecoverable_error("Read Failed!!!");
  }
  TTDAbort_unrecoverable_error("Failed to open code resource stream for reading.");
}

Assistant:

void ReadCodeFromFile(ThreadContext* threadContext, bool fromEvent, uint32 bodyId, bool isUtf8Source, byte* sourceBuffer, uint32 length)
        {
            char asciiResourceName[64];
            sprintf_s(asciiResourceName, 64, "src%s_%I32u.js", (fromEvent ? "_ld" : ""), bodyId);

            TTDataIOInfo& iofp = threadContext->TTDContext->TTDataIOInfo;
            JsTTDStreamHandle srcStream = iofp.pfOpenResourceStream(iofp.ActiveTTUriLength, iofp.ActiveTTUri, strlen(asciiResourceName), asciiResourceName, true, false);
            TTDAssert(srcStream != nullptr, "Failed to open code resource stream for reading.");

            if(isUtf8Source)
            {
                byte byteOrderArray[3] = { 0x0, 0x0, 0x0 };
                size_t byteOrderCount = 0;
                bool okBOC = iofp.pfReadBytesFromStream(srcStream, byteOrderArray, _countof(byteOrderArray), &byteOrderCount);
                TTDAssert(okBOC && byteOrderCount == _countof(byteOrderArray) && byteOrderArray[0] == 0xEF && byteOrderArray[1] == 0xBB && byteOrderArray[2] == 0xBF, "Read Failed!!!");
            }
            else
            {
                byte byteOrderArray[2] = { 0x0, 0x0 };
                size_t byteOrderCount = 0;
                bool okBOC = iofp.pfReadBytesFromStream(srcStream, byteOrderArray, _countof(byteOrderArray), &byteOrderCount);
                TTDAssert(okBOC && byteOrderCount == _countof(byteOrderArray) && byteOrderArray[0] == 0xFF && byteOrderArray[1] == 0xFE, "Read Failed!!!");
            }

            size_t readCount = 0;
            bool ok = iofp.pfReadBytesFromStream(srcStream, sourceBuffer, length, &readCount);
            TTDAssert(ok && readCount == length, "Read Failed!!!");

            iofp.pfFlushAndCloseStream(srcStream, true, false);
        }